

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgridlayout.cpp
# Opt level: O1

QRect __thiscall QGridLayoutPrivate::cellRect(QGridLayoutPrivate *this,int row,int col)

{
  uint uVar1;
  uint uVar2;
  QLayoutStruct *pQVar3;
  QLayoutStruct *pQVar4;
  QList<QLayoutStruct> *pQVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  QRect QVar10;
  
  uVar7 = 0xffffffff00000000;
  uVar8 = 0xffffffff;
  uVar6 = 0;
  if (((row < 0) || (col < 0)) || (this->rr <= row)) {
    uVar9 = 0;
  }
  else {
    uVar9 = 0;
    if (col < this->cc) {
      pQVar5 = this->hfwData;
      if (this->hfwData == (QList<QLayoutStruct> *)0x0) {
        pQVar5 = &this->rowData;
      }
      pQVar3 = (this->colData).d.ptr;
      if ((this->field_0x194 & 8) == 0) {
        pQVar5 = &this->rowData;
      }
      uVar1 = pQVar3[(uint)col].pos;
      uVar9 = (ulong)uVar1;
      pQVar4 = (pQVar5->d).ptr;
      uVar2 = pQVar4[(uint)row].pos;
      uVar8 = (ulong)((uVar1 + pQVar3[(uint)col].size) - 1);
      uVar6 = (ulong)uVar2 << 0x20;
      uVar7 = (ulong)((pQVar4[(uint)row].size + uVar2) - 1) << 0x20;
    }
  }
  QVar10._8_8_ = uVar7 | uVar8;
  QVar10._0_8_ = uVar6 | uVar9;
  return QVar10;
}

Assistant:

QRect QGridLayoutPrivate::cellRect(int row, int col) const
{
    if (row < 0 || row >= rr || col < 0 || col >= cc)
        return QRect();

    const QList<QLayoutStruct> *rDataPtr;
    if (has_hfw && hfwData)
        rDataPtr = hfwData;
    else
        rDataPtr = &rowData;
    return QRect(colData.at(col).pos, rDataPtr->at(row).pos,
                 colData.at(col).size, rDataPtr->at(row).size);
}